

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

int call_binTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  bool bVar1;
  TValue *local_40;
  TValue *tm;
  TMS event_local;
  StkId res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  local_40 = luaT_gettmbyobj(L,p1,event);
  if (local_40->tt == 0) {
    local_40 = luaT_gettmbyobj(L,p2,event);
  }
  bVar1 = local_40->tt != 0;
  if (bVar1) {
    callTMres(L,res,local_40,p1,p2);
  }
  L_local._4_4_ = (uint)bVar1;
  return L_local._4_4_;
}

Assistant:

static int call_binTM (lua_State *L, const TValue *p1, const TValue *p2,
                       StkId res, TMS event) {
  const TValue *tm = luaT_gettmbyobj(L, p1, event);  /* try first operand */
  if (ttisnil(tm))
    tm = luaT_gettmbyobj(L, p2, event);  /* try second operand */
  if (ttisnil(tm)) return 0;
  callTMres(L, res, tm, p1, p2);
  return 1;
}